

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::CreationTest::iterate(CreationTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  int *piVar8;
  char *description;
  bool bVar9;
  qpTestResult testResult;
  TestContext *this_00;
  int *piVar10;
  GLuint buffers_dsa [2];
  GLuint buffers_legacy [2];
  int local_1c0 [4];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    local_1c0[2] = 0;
    local_1c0[3] = 0;
    local_1c0[0] = 0;
    local_1c0[1] = 0;
    piVar10 = local_1c0 + 2;
    (**(code **)(lVar7 + 0x6c8))(2,piVar10);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGenBuffers have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x76);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    piVar8 = local_1c0 + 2;
    bVar3 = true;
    bVar2 = true;
    do {
      bVar9 = bVar2;
      cVar4 = (**(code **)(lVar7 + 0xc68))(*piVar8);
      if (cVar4 != '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "GenBuffers has created default objects, but it should create only a names.",0x4a
                  );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar3 = false;
      }
      piVar8 = local_1c0 + 3;
      bVar2 = false;
    } while (bVar9);
    piVar8 = local_1c0;
    (**(code **)(lVar7 + 0x3b8))(2,piVar8);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glCreateBuffers have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x88);
    bVar2 = true;
    do {
      bVar9 = bVar2;
      cVar4 = (**(code **)(lVar7 + 0xc68))(*piVar8);
      if (cVar4 == '\0') {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"CreateBuffers has not created default objects.",0x2e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar3 = false;
      }
      piVar8 = local_1c0 + 1;
      bVar2 = false;
    } while (bVar9);
    piVar8 = local_1c0;
    bVar2 = true;
    do {
      bVar9 = bVar2;
      if (*piVar10 != 0) {
        (**(code **)(lVar7 + 0x438))(1);
        *piVar10 = 0;
      }
      if (*piVar8 != 0) {
        (**(code **)(lVar7 + 0x438))(1);
        *piVar8 = 0;
      }
      piVar8 = local_1c0 + 1;
      piVar10 = local_1c0 + 3;
      bVar2 = false;
    } while (bVar9);
    do {
      iVar5 = (**(code **)(lVar7 + 0x800))();
    } while (iVar5 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Buffers' objects */
	static const glw::GLuint buffers_count = 2;

	glw::GLuint buffers_legacy[buffers_count] = {};
	glw::GLuint buffers_dsa[buffers_count]	= {};

	try
	{
		/* Check legacy state creation. */
		gl.genBuffers(buffers_count, buffers_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers have failed");

		for (glw::GLuint i = 0; i < buffers_count; ++i)
		{
			if (gl.isBuffer(buffers_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenBuffers has created default objects, but it should create only a names."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state creation. */
		gl.createBuffers(buffers_count, buffers_dsa);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers have failed");

		for (glw::GLuint i = 0; i < buffers_count; ++i)
		{
			if (!gl.isBuffer(buffers_dsa[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "CreateBuffers has not created default objects."
													<< tcu::TestLog::EndMessage;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < buffers_count; ++i)
	{
		if (buffers_legacy[i])
		{
			gl.deleteBuffers(1, &buffers_legacy[i]);

			buffers_legacy[i] = 0;
		}

		if (buffers_dsa[i])
		{
			gl.deleteBuffers(1, &buffers_dsa[i]);

			buffers_dsa[i] = 0;
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}